

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

OPJ_OFF_T opj_stream_write_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  opj_bool oVar1;
  long lVar2;
  opj_event_mgr_t *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  OPJ_OFF_T l_skip_nb_bytes;
  OPJ_OFF_T l_current_skip_nb_bytes;
  opj_bool l_is_written;
  opj_event_mgr_t *in_stack_ffffffffffffffc0;
  long local_18;
  OPJ_OFF_T local_8;
  
  local_8 = 0;
  if ((*(uint *)((long)in_RDI + 100) & 8) == 0) {
    oVar1 = opj_stream_flush((opj_stream_private_t *)0x0,in_stack_ffffffffffffffc0);
    local_18 = in_RSI;
    if (oVar1 == 0) {
      *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) | 8;
      *(undefined4 *)(in_RDI + 10) = 0;
      in_RDI[7] = in_RDI[7];
      local_8 = -1;
    }
    else {
      for (; 0 < local_18; local_18 = local_18 - lVar2) {
        lVar2 = (*(code *)in_RDI[4])(local_18,*in_RDI);
        if (lVar2 == -1) {
          opj_event_msg_v2(in_RDX,4,"Stream error!\n");
          *(uint *)((long)in_RDI + 100) = *(uint *)((long)in_RDI + 100) | 8;
          in_RDI[0xb] = local_8 + in_RDI[0xb];
          if (local_8 != 0) {
            return local_8;
          }
          return -1;
        }
        local_8 = lVar2 + local_8;
      }
      in_RDI[0xb] = local_8 + in_RDI[0xb];
    }
  }
  else {
    local_8 = -1;
  }
  return local_8;
}

Assistant:

OPJ_OFF_T opj_stream_write_skip (opj_stream_private_t * p_stream, OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
	opj_bool l_is_written = 0;
	OPJ_OFF_T l_current_skip_nb_bytes = 0;
	OPJ_OFF_T l_skip_nb_bytes = 0;

	if
		(p_stream->m_status & opj_stream_e_error)
	{
		return (OPJ_OFF_T) -1;
	}

	// we should flush data
	l_is_written = opj_stream_flush (p_stream, p_event_mgr);
	if
		(! l_is_written)
	{
		p_stream->m_status |= opj_stream_e_error;
		p_stream->m_bytes_in_buffer = 0;
		p_stream->m_current_data = p_stream->m_current_data;
		return (OPJ_OFF_T) -1;
	}
	// then skip

	while
		(p_size > 0)
	{
		// we should do an actual skip on the media
		l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);
		if
			(l_current_skip_nb_bytes == (OPJ_OFF_T)-1)
		{
			opj_event_msg_v2(p_event_mgr, EVT_INFO, "Stream error!\n");

			p_stream->m_status |= opj_stream_e_error;
			p_stream->m_byte_offset += l_skip_nb_bytes;
			// end if stream
			return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T)-1;
		}
		p_size -= l_current_skip_nb_bytes;
		l_skip_nb_bytes += l_current_skip_nb_bytes;
	}
	p_stream->m_byte_offset += l_skip_nb_bytes;
	return l_skip_nb_bytes;
}